

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O3

vec<4,_float,_(glm::qualifier)0> __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::
getData_helper<glm::vec<4,float,(glm::qualifier)0>>(GLAttributeBuffer *this,size_t ind)

{
  ulong uVar1;
  string local_30;
  
  if (((this->super_AttributeBuffer).setFlag != true) ||
     (uVar1 = (long)(this->super_AttributeBuffer).arrayCount *
              (this->super_AttributeBuffer).dataSize, uVar1 < ind || uVar1 - ind == 0)) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"bad getData","");
    exception(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return (vec<4,_float,_(glm::qualifier)0>)ZEXT816(0);
}

Assistant:

T GLAttributeBuffer::getData_helper(size_t ind) {
  if (!isSet() || ind >= static_cast<size_t>(getDataSize() * getArrayCount())) exception("bad getData");
  bind();
  T readValue{};
  return readValue;
}